

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  
  uVar10 = n >> 2;
  uVar21 = 1;
  if (8 < (int)uVar10) {
    uVar21 = 1;
    uVar11 = uVar10;
    do {
      uVar21 = uVar21 * 2;
      uVar10 = uVar11 >> 2;
      bVar4 = 0x23 < uVar11;
      uVar11 = uVar10;
    } while (bVar4);
  }
  iVar28 = n >> 1;
  uVar11 = uVar21 * 4;
  uVar25 = (ulong)uVar11;
  if (uVar10 == 8) {
    if (0 < (int)uVar21) {
      lVar7 = (long)iVar28;
      uVar15 = (ulong)uVar21;
      iVar6 = uVar21 * 8;
      lVar26 = 0;
      uVar24 = 0;
      do {
        if (uVar24 != 0) {
          lVar27 = (long)ip[uVar15 + uVar24];
          iVar12 = ip[uVar15 + uVar24] * 2;
          lVar16 = lVar7 + uVar25 + lVar27 * 2;
          lVar9 = lVar7 + uVar25 * 2 + lVar27 * 2;
          lVar17 = uVar25 * 3 + lVar7 + lVar27 * 2;
          lVar13 = lVar27 << 0x21;
          lVar14 = 0;
          lVar23 = lVar7 << 0x20;
          do {
            lVar8 = (long)((int)uVar24 * 4) + (long)*(int *)((long)ip + lVar14 + uVar15 * 4) * 2;
            dVar1 = a[lVar27 * 2 + lVar14];
            dVar2 = a[lVar27 * 2 + lVar14 + 1];
            uVar10 = (uint)lVar8;
            dVar3 = a[(int)(uVar10 | 1)];
            a[lVar27 * 2 + lVar14] = a[lVar8];
            a[lVar27 * 2 + lVar14 + 1] = dVar3;
            a[lVar8] = dVar1;
            a[(int)(uVar10 | 1)] = dVar2;
            iVar29 = uVar10 + iVar6;
            dVar1 = a[uVar25 + lVar27 * 2 + lVar14];
            dVar2 = a[uVar25 + lVar27 * 2 + lVar14 + 1];
            iVar5 = uVar10 + 1 + iVar6;
            dVar3 = a[iVar5];
            a[uVar25 + lVar27 * 2 + lVar14] = a[iVar29];
            a[uVar25 + lVar27 * 2 + lVar14 + 1] = dVar3;
            a[iVar29] = dVar1;
            a[iVar5] = dVar2;
            uVar10 = iVar29 + uVar21 * -4;
            dVar1 = a[uVar25 * 2 + lVar27 * 2 + lVar14];
            dVar2 = a[uVar25 * 2 + lVar27 * 2 + lVar14 + 1];
            dVar3 = a[(int)(uVar10 | 1)];
            a[uVar25 * 2 + lVar27 * 2 + lVar14] = a[(int)uVar10];
            a[uVar25 * 2 + lVar27 * 2 + lVar14 + 1] = dVar3;
            a[(int)uVar10] = dVar1;
            a[(int)(uVar10 | 1)] = dVar2;
            dVar1 = a[uVar25 * 3 + lVar27 * 2 + lVar14];
            dVar2 = a[uVar25 * 3 + lVar27 * 2 + lVar14 + 1];
            lVar8 = (long)(int)(uVar10 + iVar6);
            iVar5 = uVar10 + 1 + iVar6;
            dVar3 = a[iVar5];
            a[uVar25 * 3 + lVar27 * 2 + lVar14] = a[lVar8];
            a[uVar25 * 3 + lVar27 * 2 + lVar14 + 1] = dVar3;
            a[lVar8] = dVar1;
            a[iVar5] = dVar2;
            dVar1 = a[lVar17 + lVar14];
            dVar2 = (a + lVar17 + lVar14)[1];
            dVar3 = (a + lVar8 + 2)[1];
            a[lVar17 + lVar14] = a[lVar8 + 2];
            (a + lVar17 + lVar14)[1] = dVar3;
            a[lVar8 + 2] = dVar1;
            (a + lVar8 + 2)[1] = dVar2;
            dVar1 = a[lVar9 + lVar14];
            dVar2 = (a + lVar9 + lVar14)[1];
            dVar3 = (a + (int)(uVar10 + 2))[1];
            a[lVar9 + lVar14] = a[(int)(uVar10 + 2)];
            (a + lVar9 + lVar14)[1] = dVar3;
            a[(int)(uVar10 + 2)] = dVar1;
            (a + (int)(uVar10 + 2))[1] = dVar2;
            iVar5 = uVar10 + 2 + uVar11;
            dVar1 = a[lVar16 + lVar14];
            dVar2 = (a + lVar16 + lVar14)[1];
            dVar3 = (a + iVar5)[1];
            a[lVar16 + lVar14] = a[iVar5];
            (a + lVar16 + lVar14)[1] = dVar3;
            iVar29 = iVar5 + uVar21 * -8;
            a[iVar5] = dVar1;
            (a + iVar5)[1] = dVar2;
            dVar1 = (a + iVar29)[1];
            dVar2 = a[lVar7 + lVar27 * 2 + lVar14];
            dVar3 = (a + lVar7 + lVar27 * 2 + lVar14)[1];
            a[lVar7 + lVar27 * 2 + lVar14] = a[iVar29];
            (a + lVar7 + lVar27 * 2 + lVar14)[1] = dVar1;
            a[iVar29] = dVar2;
            (a + iVar29)[1] = dVar3;
            dVar1 = a[lVar7 + lVar27 * 2 + lVar14 + 2];
            dVar2 = (a + lVar7 + lVar27 * 2 + lVar14 + 2)[1];
            dVar3 = (a + (iVar29 + iVar28))[1];
            a[lVar7 + lVar27 * 2 + lVar14 + 2] = a[iVar29 + iVar28];
            (a + lVar7 + lVar27 * 2 + lVar14 + 2)[1] = dVar3;
            a[iVar29 + iVar28] = dVar1;
            (a + (iVar29 + iVar28))[1] = dVar2;
            lVar22 = (long)(lVar13 + (uVar25 << 0x20) + 0x200000000 + lVar23) >> 0x1d;
            dVar1 = *(double *)((long)a + lVar22);
            lVar20 = (long)((uVar25 << 0x20) + 0x300000000 + lVar13 + lVar23) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar20);
            lVar8 = (long)(iVar5 + iVar28);
            dVar3 = a[lVar8 + 1];
            *(double *)((long)a + lVar22) = a[lVar8];
            *(double *)((long)a + lVar20) = dVar3;
            a[lVar8] = dVar1;
            iVar18 = iVar28 + uVar10;
            iVar5 = iVar18 + 2;
            lVar20 = (long)((uVar25 << 0x21) + 0x200000000 + lVar13 + lVar23) >> 0x1d;
            a[lVar8 + 1] = dVar2;
            dVar1 = *(double *)((long)a + lVar20);
            lVar8 = (long)((uVar25 << 0x21) + 0x300000000 + lVar13 + lVar23) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar8);
            dVar3 = a[(long)iVar5 + 1];
            *(double *)((long)a + lVar20) = a[iVar5];
            *(double *)((long)a + lVar8) = dVar3;
            a[iVar5] = dVar1;
            iVar29 = (int)lVar14;
            iVar19 = iVar12 + iVar28 + 2 + uVar21 * 0xc + iVar29;
            a[(long)iVar5 + 1] = dVar2;
            dVar1 = a[iVar19];
            lVar8 = (long)((uVar25 * 3 << 0x20) + 0x300000000 + lVar13 + lVar23) >> 0x1d;
            dVar2 = *(double *)((long)a + lVar8);
            lVar20 = (long)(iVar5 + iVar6);
            dVar3 = a[lVar20 + 1];
            a[iVar19] = a[lVar20];
            *(double *)((long)a + lVar8) = dVar3;
            a[lVar20] = dVar1;
            a[lVar20 + 1] = dVar2;
            lVar8 = (long)(int)(uVar21 * 0xc + 2 + iVar12 + iVar29);
            dVar2 = a[lVar8];
            dVar3 = (a + lVar8)[1];
            dVar1 = a[lVar20 + -1];
            a[lVar8] = a[lVar20 + -2];
            a[lVar8 + 1] = dVar1;
            a[lVar20 + -2] = dVar2;
            (a + lVar20 + -2)[1] = dVar3;
            iVar19 = uVar21 * 8 + 2 + iVar12 + iVar29;
            dVar1 = a[iVar19];
            dVar2 = (a + iVar19)[1];
            dVar3 = (a + iVar18)[1];
            a[iVar19] = a[iVar18];
            (a + iVar19)[1] = dVar3;
            a[iVar18] = dVar1;
            (a + iVar18)[1] = dVar2;
            iVar18 = uVar11 + 2 + iVar12 + iVar29;
            iVar5 = (uVar11 - 2) + iVar5;
            dVar1 = a[iVar18];
            dVar2 = (a + iVar18)[1];
            dVar3 = (a + iVar5)[1];
            a[iVar18] = a[iVar5];
            (a + iVar18)[1] = dVar3;
            a[iVar5] = dVar1;
            (a + iVar5)[1] = dVar2;
            iVar29 = iVar12 + 2 + iVar29;
            iVar5 = iVar5 + uVar21 * -8;
            dVar1 = a[iVar29];
            dVar2 = (a + iVar29)[1];
            dVar3 = (a + iVar5)[1];
            a[iVar29] = a[iVar5];
            (a + iVar29)[1] = dVar3;
            a[iVar5] = dVar1;
            (a + iVar5)[1] = dVar2;
            lVar14 = lVar14 + 4;
            lVar23 = lVar23 + 0x400000000;
          } while (lVar26 != lVar14);
        }
        iVar12 = (int)uVar24 * 4;
        lVar16 = (long)iVar12 + (long)ip[uVar15 + uVar24] * 2;
        iVar12 = iVar12 + 2 + ip[uVar15 + uVar24] * 2;
        dVar1 = a[lVar16 + 2];
        iVar5 = (int)lVar16;
        iVar29 = iVar28 + iVar5;
        dVar2 = a[(long)iVar5 + 3];
        dVar3 = a[(long)iVar29 + 1];
        a[lVar16 + 2] = a[iVar29];
        a[(long)iVar5 + 3] = dVar3;
        a[iVar29] = dVar1;
        a[(long)iVar29 + 1] = dVar2;
        iVar5 = iVar12 + uVar11;
        iVar29 = iVar29 + iVar6;
        dVar1 = a[iVar5];
        iVar12 = iVar12 + uVar11 + 1;
        dVar2 = a[iVar12];
        dVar3 = a[(long)iVar29 + 1];
        a[iVar5] = a[iVar29];
        a[iVar12] = dVar3;
        a[iVar29] = dVar1;
        a[(long)iVar29 + 1] = dVar2;
        iVar12 = iVar5 + uVar11;
        iVar29 = iVar29 + uVar21 * -4;
        dVar1 = a[iVar12];
        iVar5 = iVar5 + uVar11 + 1;
        dVar2 = a[iVar5];
        dVar3 = a[(long)iVar29 + 1];
        a[iVar12] = a[iVar29];
        a[iVar5] = dVar3;
        a[iVar29] = dVar1;
        a[(long)iVar29 + 1] = dVar2;
        dVar1 = a[(long)iVar12 + -2];
        dVar2 = (a + (long)iVar12 + -2)[1];
        dVar3 = (a + (iVar29 - iVar28))[1];
        a[(long)iVar12 + -2] = a[iVar29 - iVar28];
        (a + (long)iVar12 + -2)[1] = dVar3;
        a[iVar29 - iVar28] = dVar1;
        (a + (iVar29 - iVar28))[1] = dVar2;
        lVar16 = (long)(iVar12 + iVar28);
        dVar1 = a[lVar16];
        dVar2 = a[lVar16 + 1];
        dVar3 = a[iVar29 + 3];
        a[lVar16] = a[iVar29 + 2];
        a[lVar16 + 1] = dVar3;
        a[iVar29 + 2] = dVar1;
        a[iVar29 + 3] = dVar2;
        dVar1 = a[(int)(iVar12 + uVar11)];
        iVar5 = iVar12 + uVar11 + 1;
        dVar2 = a[iVar5];
        lVar16 = (long)(iVar29 + iVar6);
        dVar3 = a[lVar16 + 1];
        a[(int)(iVar12 + uVar11)] = a[lVar16];
        a[iVar5] = dVar3;
        a[lVar16] = dVar1;
        a[lVar16 + 1] = dVar2;
        uVar24 = uVar24 + 1;
        lVar26 = lVar26 + 4;
      } while (uVar24 != uVar15);
    }
  }
  else if (0 < (int)uVar21) {
    lVar7 = (long)iVar28;
    uVar24 = (ulong)uVar21;
    lVar26 = 0;
    uVar15 = 0;
    do {
      if (uVar15 != 0) {
        iVar6 = ip[uVar24 + uVar15];
        lVar9 = (long)iVar6;
        lVar16 = lVar7 + uVar25 + lVar9;
        lVar23 = (lVar16 << 0x20) + 0x300000000;
        lVar17 = 0;
        do {
          lVar13 = (long)*(int *)((long)ip + lVar17 + uVar24 * 4) + (long)((int)uVar15 * 4);
          dVar1 = a[lVar9 + lVar17];
          dVar2 = (a + lVar9 + lVar17)[1];
          dVar3 = (a + lVar13)[1];
          a[lVar9 + lVar17] = a[lVar13];
          (a + lVar9 + lVar17)[1] = dVar3;
          a[lVar13] = dVar1;
          (a + lVar13)[1] = dVar2;
          iVar12 = (int)lVar13;
          iVar29 = iVar12 + uVar11;
          dVar1 = a[uVar25 + lVar9 + lVar17];
          dVar2 = (a + uVar25 + lVar9 + lVar17)[1];
          dVar3 = (a + iVar29)[1];
          a[uVar25 + lVar9 + lVar17] = a[iVar29];
          (a + uVar25 + lVar9 + lVar17)[1] = dVar3;
          a[iVar29] = dVar1;
          (a + iVar29)[1] = dVar2;
          dVar2 = a[lVar16 + lVar17];
          dVar3 = (a + lVar16 + lVar17)[1];
          dVar1 = a[(long)iVar29 + 3];
          a[lVar16 + lVar17] = a[(long)iVar29 + 2];
          a[lVar16 + lVar17 + 1] = dVar1;
          a[(long)iVar29 + 2] = dVar2;
          (a + (long)iVar29 + 2)[1] = dVar3;
          dVar1 = (a + (iVar12 + 2))[1];
          dVar2 = a[lVar7 + lVar9 + lVar17];
          dVar3 = (a + lVar7 + lVar9 + lVar17)[1];
          a[lVar7 + lVar9 + lVar17] = a[iVar12 + 2];
          (a + lVar7 + lVar9 + lVar17)[1] = dVar1;
          a[iVar12 + 2] = dVar2;
          (a + (iVar12 + 2))[1] = dVar3;
          iVar5 = iVar12 + 2 + iVar28;
          dVar1 = a[lVar7 + lVar9 + lVar17 + 2];
          dVar2 = (a + lVar7 + lVar9 + lVar17 + 2)[1];
          dVar3 = (a + iVar5)[1];
          a[lVar7 + lVar9 + lVar17 + 2] = a[iVar5];
          (a + lVar7 + lVar9 + lVar17 + 2)[1] = dVar3;
          a[iVar5] = dVar1;
          (a + iVar5)[1] = dVar2;
          iVar5 = (int)lVar17;
          iVar18 = uVar11 + 2 + iVar28 + iVar6 + iVar5;
          dVar1 = a[iVar18];
          dVar2 = *(double *)((long)a + (lVar23 >> 0x1d));
          lVar13 = (long)(iVar28 + 2 + iVar29);
          dVar3 = a[lVar13 + 1];
          a[iVar18] = a[lVar13];
          *(double *)((long)a + (lVar23 >> 0x1d)) = dVar3;
          a[lVar13] = dVar1;
          a[lVar13 + 1] = dVar2;
          iVar18 = uVar11 + 2 + iVar6 + iVar5;
          dVar1 = a[iVar18];
          dVar2 = (a + iVar18)[1];
          dVar3 = (a + (iVar29 + iVar28))[1];
          a[iVar18] = a[iVar29 + iVar28];
          (a + iVar18)[1] = dVar3;
          a[iVar29 + iVar28] = dVar1;
          (a + (iVar29 + iVar28))[1] = dVar2;
          iVar5 = iVar6 + 2 + iVar5;
          dVar1 = a[iVar5];
          dVar2 = (a + iVar5)[1];
          dVar3 = (a + (iVar12 + iVar28))[1];
          a[iVar5] = a[iVar12 + iVar28];
          (a + iVar5)[1] = dVar3;
          a[iVar12 + iVar28] = dVar1;
          (a + (iVar12 + iVar28))[1] = dVar2;
          lVar17 = lVar17 + 4;
          lVar23 = lVar23 + 0x400000000;
        } while (lVar26 != lVar17);
      }
      iVar6 = ip[uVar24 + uVar15];
      iVar12 = (int)uVar15 * 4;
      lVar16 = (long)iVar6 + (long)iVar12;
      dVar1 = a[lVar16 + 2];
      iVar5 = (int)lVar16;
      iVar29 = iVar5 + iVar28;
      dVar2 = a[(long)iVar5 + 3];
      dVar3 = a[(long)iVar29 + 1];
      a[lVar16 + 2] = a[iVar29];
      a[(long)iVar5 + 3] = dVar3;
      a[iVar29] = dVar1;
      a[(long)iVar29 + 1] = dVar2;
      iVar6 = iVar6 + 2 + iVar12 + uVar11;
      dVar1 = a[iVar6];
      dVar2 = (a + iVar6)[1];
      dVar3 = (a + (int)(iVar29 + uVar11))[1];
      a[iVar6] = a[(int)(iVar29 + uVar11)];
      (a + iVar6)[1] = dVar3;
      a[(int)(iVar29 + uVar11)] = dVar1;
      (a + (int)(iVar29 + uVar11))[1] = dVar2;
      uVar15 = uVar15 + 1;
      lVar26 = lVar26 + 4;
    } while (uVar15 != uVar24);
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a) {
  int j, j1, k, k1, l, m, nh, nm;
  double xr, xi, yr, yi;

  m = 1;
  for (l = n >> 2; l > 8; l >>= 2) {
    m <<= 1;
  }
  nh = n >> 1;
  nm = 4 * m;
  if (l == 8) {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + 2 * ip[m + k];
        k1 = 4 * k + 2 * ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + 2 * ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += 2 * nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 -= nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= 2;
      k1 -= nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nh + 2;
      k1 += nh + 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= nh - nm;
      k1 += 2 * nm - 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  } else {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + ip[m + k];
        k1 = 4 * k + ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  }
}